

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O1

Vec_Int_t * findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone,Vec_Int_t *vHintMonotone)

{
  Vec_Int_t *p;
  long lVar1;
  long lVar2;
  
  p = vHintMonotone;
  if ((vKnownMonotone != (Vec_Int_t *)0x0) && (0 < vKnownMonotone->nSize)) {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 0;
    p->nSize = 0;
    p->pArray = (int *)0x0;
    if (0 < vHintMonotone->nSize) {
      lVar2 = 0;
      do {
        if (0 < (long)vKnownMonotone->nSize) {
          lVar1 = 0;
          do {
            if (vKnownMonotone->pArray[lVar1] == vHintMonotone->pArray[lVar2]) goto LAB_008f6b7b;
            lVar1 = lVar1 + 1;
          } while (vKnownMonotone->nSize != lVar1);
        }
        Vec_IntPush(p,vHintMonotone->pArray[lVar2]);
LAB_008f6b7b:
        lVar2 = lVar2 + 1;
      } while (lVar2 < vHintMonotone->nSize);
    }
  }
  return p;
}

Assistant:

Vec_Int_t *findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone, Vec_Int_t *vHintMonotone)
{
    Vec_Int_t *vCandMonotone;
    int iElem, i;

    if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
        return vHintMonotone;
    vCandMonotone = Vec_IntAlloc(0);
    Vec_IntForEachEntry( vHintMonotone, iElem, i )
    {
        if( Vec_IntFind( vKnownMonotone, iElem ) == -1 )
            Vec_IntPush( vCandMonotone, iElem );
    }
    
    return vCandMonotone;
}